

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

int yang_fill_unique(lys_module *module,lys_node_list *list,lys_unique *unique,char *value,
                    unres_schema *unres)

{
  int iVar1;
  char *pcVar2;
  ushort **ppuVar3;
  char **ppcVar4;
  char *pcVar5;
  ulong uVar6;
  undefined8 *item;
  LY_ERR *pLVar7;
  ulong uVar8;
  byte bVar9;
  
  bVar9 = unique->expr_size;
  pcVar2 = value;
  while( true ) {
    pcVar2 = strpbrk(pcVar2," \t\n");
    bVar9 = bVar9 + 1;
    unique->expr_size = bVar9;
    if (pcVar2 == (char *)0x0) break;
    ppuVar3 = __ctype_b_loc();
    pcVar2 = pcVar2 + -1;
    do {
      pcVar5 = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    } while ((*(byte *)((long)*ppuVar3 + (long)*pcVar5 * 2 + 1) & 0x20) != 0);
  }
  ppcVar4 = (char **)calloc((ulong)bVar9,8);
  unique->expr = ppcVar4;
  if (ppcVar4 == (char **)0x0) {
    pLVar7 = ly_errno_location();
    *pLVar7 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_fill_unique");
LAB_00147a44:
    iVar1 = 1;
  }
  else {
    for (uVar8 = 0; uVar8 < bVar9; uVar8 = uVar8 + 1) {
      pcVar2 = strpbrk(value," \t\n");
      if (pcVar2 == (char *)0x0) {
        pcVar2 = value;
      }
      pcVar5 = lydict_insert(module->ctx,value,(long)pcVar2 - (long)value);
      unique->expr[uVar8] = pcVar5;
      uVar6 = 0;
      while (uVar8 != uVar6) {
        pcVar5 = unique->expr[uVar8];
        ppcVar4 = unique->expr + uVar6;
        uVar6 = uVar6 + 1;
        if (*ppcVar4 == pcVar5) {
          ly_vlog(LYE_INARG,LY_VLOG_LYS,list,pcVar5,"unique");
          ly_vlog(LYE_SPEC,LY_VLOG_LYS,list,"The identifier is not unique");
          goto LAB_00147a44;
        }
      }
      if (unres == (unres_schema *)0x0) {
        iVar1 = resolve_unique((lys_node *)list,unique->expr[uVar8],&unique->trg_type);
        if (iVar1 != 0) goto LAB_00147a44;
      }
      else {
        item = (undefined8 *)malloc(0x18);
        *item = list;
        item[1] = unique->expr[uVar8];
        item[2] = &unique->trg_type;
        iVar1 = unres_schema_add_node(module,unres,item,UNRES_LIST_UNIQ,(lys_node *)0x0);
        if (iVar1 == -1) goto LAB_00147a44;
      }
      ppuVar3 = __ctype_b_loc();
      value = pcVar2 + -1;
      do {
        pcVar2 = value + 1;
        value = value + 1;
      } while ((*(byte *)((long)*ppuVar3 + (long)*pcVar2 * 2 + 1) & 0x20) != 0);
      bVar9 = unique->expr_size;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
yang_fill_unique(struct lys_module *module, struct lys_node_list *list, struct lys_unique *unique, char *value, struct unres_schema *unres)
{
    int i, j;
    char *vaux;
    struct unres_list_uniq *unique_info;

    /* count the number of unique leafs in the value */
    vaux = value;
    while ((vaux = strpbrk(vaux, " \t\n"))) {
       unique->expr_size++;
        while (isspace(*vaux)) {
            vaux++;
        }
    }
    unique->expr_size++;
    unique->expr = calloc(unique->expr_size, sizeof *unique->expr);
    if (!unique->expr) {
        LOGMEM;
        goto error;
    }

    for (i = 0; i < unique->expr_size; i++) {
        vaux = strpbrk(value, " \t\n");
        if (!vaux) {
            /* the last token, lydict_insert() will count its size on its own */
            vaux = value;
        }

        /* store token into unique structure */
        unique->expr[i] = lydict_insert(module->ctx, value, vaux - value);

        /* check that the expression does not repeat */
        for (j = 0; j < i; j++) {
            if (ly_strequal(unique->expr[j], unique->expr[i], 1)) {
                LOGVAL(LYE_INARG, LY_VLOG_LYS, list, unique->expr[i], "unique");
                LOGVAL(LYE_SPEC, LY_VLOG_LYS, list, "The identifier is not unique");
                goto error;
            }
        }
        /* try to resolve leaf */
        if (unres) {
            unique_info = malloc(sizeof *unique_info);
            unique_info->list = (struct lys_node *)list;
            unique_info->expr = unique->expr[i];
            unique_info->trg_type = &unique->trg_type;
            if (unres_schema_add_node(module, unres, unique_info, UNRES_LIST_UNIQ, NULL) == -1) {
                goto error;
            }
        } else {
            if (resolve_unique((struct lys_node *)list, unique->expr[i], &unique->trg_type)) {
                goto error;
            }
        }

        /* move to next token */
        value = vaux;
        while(isspace(*value)) {
            value++;
        }
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}